

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdCheck1Step(void *p,word *pTruth,int nVarsInit,int *pVarLevels)

{
  undefined4 uVar1;
  int iVar;
  ulong uVar2;
  int nWords;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int pVarPrios [12];
  word pCofTemp [64];
  
  nWords = 1 << ((char)nVarsInit - 6U & 0x1f);
  if (nVarsInit < 7) {
    nWords = 1;
  }
  iVar3 = Dau_DsdDecompose(pTruth,nVarsInit,0,0,(char *)0x0);
  if (iVar3 == 0) {
    iVar3 = -1;
  }
  else {
    if (iVar3 < 1) {
      __assert_fail("nSizeNonDec > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x387,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
    }
    uVar8 = 0;
    uVar14 = 0;
    if (0 < nVarsInit) {
      uVar14 = (ulong)(uint)nVarsInit;
    }
    for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
      pVarPrios[uVar8] = (int)uVar8;
    }
    if (pVarLevels != (int *)0x0) {
      for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
        iVar3 = Dau_DsdLevelVar(p,(int)uVar8);
        *(int *)((long)pCofTemp + uVar8 * 4) = -iVar3;
      }
      iVar3 = 1;
      if (1 < nVarsInit) {
        iVar3 = nVarsInit;
      }
      uVar8 = 1;
      for (uVar9 = 0; uVar9 != iVar3 - 1; uVar9 = uVar9 + 1) {
        uVar13 = uVar9 & 0xffffffff;
        for (uVar11 = uVar8; lVar12 = (long)(int)uVar13, (uint)nVarsInit != uVar11;
            uVar11 = uVar11 + 1) {
          uVar2 = uVar11 & 0xffffffff;
          if (*(int *)((long)pCofTemp + lVar12 * 4) <= *(int *)((long)pCofTemp + uVar11 * 4)) {
            uVar2 = uVar13;
          }
          uVar13 = uVar2;
        }
        iVar10 = pVarPrios[uVar9];
        pVarPrios[uVar9] = pVarPrios[lVar12];
        uVar1 = *(undefined4 *)((long)pCofTemp + uVar9 * 4);
        *(undefined4 *)((long)pCofTemp + uVar9 * 4) = *(undefined4 *)((long)pCofTemp + lVar12 * 4);
        pVarPrios[lVar12] = iVar10;
        *(undefined4 *)((long)pCofTemp + lVar12 * 4) = uVar1;
        uVar8 = uVar8 + 1;
      }
    }
    iVar10 = 1000000000;
    iVar3 = -2;
    for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
      iVar = pVarPrios[uVar8];
      if ((iVar < 0) || (nVarsInit <= iVar)) {
        __assert_fail("pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x39b,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
      }
      Abc_TtCofactor0p(pCofTemp,pTruth,nWords,iVar);
      iVar4 = Abc_TtSupportSize(pCofTemp,nVarsInit);
      iVar5 = Dau_DsdDecompose(pCofTemp,nVarsInit,0,0,(char *)0x0);
      Abc_TtCofactor1p(pCofTemp,pTruth,nWords,iVar);
      iVar6 = Abc_TtSupportSize(pCofTemp,nVarsInit);
      iVar7 = Dau_DsdDecompose(pCofTemp,nVarsInit,0,0,(char *)0x0);
      if ((iVar7 == 0 && iVar5 == 0) && iVar6 + iVar4 < iVar10) {
        iVar10 = iVar6 + iVar4;
        iVar3 = iVar;
      }
    }
  }
  return iVar3;
}

Assistant:

int Dau_DsdCheck1Step( void * p, word * pTruth, int nVarsInit, int * pVarLevels )
{
    word pCofTemp[DAU_MAX_WORD];
    int pVarPrios[DAU_MAX_VAR];
    int nWords = Abc_TtWordNum(nVarsInit);
    int nSizeNonDec, nSizeNonDec0, nSizeNonDec1;
    int i, vBest = -2, nSumCofsBest = ABC_INFINITY, nSumCofs;
    nSizeNonDec = Dau_DsdDecompose( pTruth, nVarsInit, 0, 0, NULL );
    if ( nSizeNonDec == 0 )
        return -1;
    assert( nSizeNonDec > 0 );
    // find variable priority
    for ( i = 0; i < nVarsInit; i++ )
        pVarPrios[i] = i;
    if ( pVarLevels )
    {
        extern int Dau_DsdLevelVar( void * pMan, int iVar );
        int pVarLevels[DAU_MAX_VAR];
        for ( i = 0; i < nVarsInit; i++ )
            pVarLevels[i] = -Dau_DsdLevelVar( p, i );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", -pVarLevels[i] );
//        printf( "\n" );
        Vec_IntSelectSortCost2( pVarPrios, nVarsInit, pVarLevels );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", pVarPrios[i] );
//        printf( "\n\n" );
    }
    for ( i = 0; i < nVarsInit; i++ )
    {
        assert( pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit );
        // try first cofactor
        Abc_TtCofactor0p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs = Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec0 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // try second cofactor
        Abc_TtCofactor1p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs += Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec1 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // compare cofactors
        if ( nSizeNonDec0 || nSizeNonDec1 )
            continue;
        if ( nSumCofsBest > nSumCofs )
        {
            vBest = pVarPrios[i];
            nSumCofsBest = nSumCofs;
        }
    }
    return vBest;
}